

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

cmValue __thiscall cmMakefile::GetDefinition(cmMakefile *this,string *name)

{
  bool bVar1;
  cmState *pcVar2;
  cmVariableWatch *this_00;
  char *newValue;
  bool watch_function_executed;
  cmVariableWatch *vv;
  string *name_local;
  cmMakefile *this_local;
  cmValue def;
  
  this_local = (cmMakefile *)cmStateSnapshot::GetDefinition(&this->StateSnapshot,name);
  bVar1 = cmValue::operator_cast_to_bool((cmValue *)&this_local);
  if (!bVar1) {
    pcVar2 = GetState(this);
    this_local = (cmMakefile *)cmState::GetInitializedCacheValue(pcVar2,name);
  }
  this_00 = GetVariableWatch(this);
  if ((this_00 != (cmVariableWatch *)0x0) && ((this->SuppressSideEffects & 1U) == 0)) {
    bVar1 = cmValue::operator_cast_to_bool((cmValue *)&this_local);
    newValue = cmValue::GetCStr((cmValue *)&this_local);
    bVar1 = cmVariableWatch::VariableAccessed(this_00,name,(uint)!bVar1,newValue,this);
    if (bVar1) {
      this_local = (cmMakefile *)cmStateSnapshot::GetDefinition(&this->StateSnapshot,name);
      bVar1 = cmValue::operator_cast_to_bool((cmValue *)&this_local);
      if (!bVar1) {
        pcVar2 = GetState(this);
        this_local = (cmMakefile *)cmState::GetInitializedCacheValue(pcVar2,name);
      }
    }
  }
  return (cmValue)(string *)this_local;
}

Assistant:

cmValue cmMakefile::GetDefinition(const std::string& name) const
{
  cmValue def = this->StateSnapshot.GetDefinition(name);
  if (!def) {
    def = this->GetState()->GetInitializedCacheValue(name);
  }
#ifndef CMAKE_BOOTSTRAP
  cmVariableWatch* vv = this->GetVariableWatch();
  if (vv && !this->SuppressSideEffects) {
    bool const watch_function_executed =
      vv->VariableAccessed(name,
                           def ? cmVariableWatch::VARIABLE_READ_ACCESS
                               : cmVariableWatch::UNKNOWN_VARIABLE_READ_ACCESS,
                           def.GetCStr(), this);

    if (watch_function_executed) {
      // A callback was executed and may have caused re-allocation of the
      // variable storage.  Look it up again for now.
      // FIXME: Refactor variable storage to avoid this problem.
      def = this->StateSnapshot.GetDefinition(name);
      if (!def) {
        def = this->GetState()->GetInitializedCacheValue(name);
      }
    }
  }
#endif
  return def;
}